

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

int __thiscall CTcSymMetaclassBase::write_to_sym_file(CTcSymMetaclassBase *this,CVmFile *fp)

{
  uint16_t tmp;
  char *__s;
  size_t buflen;
  char b_1 [1];
  char b [2];
  char local_1b;
  undefined2 local_1a;
  
  local_1a = *(undefined2 *)
              &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
               field_0x24;
  CVmFile::write_bytes(fp,(char *)&local_1a,2);
  CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
  __s = CTcGenTarg::get_meta_name(G_cg,this->meta_idx_);
  buflen = strlen(__s);
  local_1b = (char)buflen;
  CVmFile::write_bytes(fp,&local_1b,1);
  CVmFile::write_bytes(fp,__s,buflen);
  return 1;
}

Assistant:

int CTcSymMetaclassBase::write_to_sym_file(class CVmFile *fp)
{
    /* inherit the base class handling to write the symbol */
    CTcSymbol::write_to_sym_file(fp);

    /* add the metaclass ID string */
    const char *id = G_cg->get_meta_name(meta_idx_);
    size_t idlen = strlen(id);
    fp->write_byte((char)idlen);
    fp->write_bytes(id, idlen);

    /* success */
    return TRUE; 
}